

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ogf_v3.cxx
# Opt level: O2

void __thiscall xray_re::xr_ogf_v3::load_kinematics(xr_ogf_v3 *this,xr_reader *r)

{
  pointer ppxVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  xr_reader *r_00;
  size_t sVar5;
  undefined4 extraout_var;
  size_t i;
  long lVar7;
  long lVar8;
  long lVar9;
  xr_reader *s;
  long local_48;
  fvector3 temp;
  long lVar6;
  
  load_hierrarhy_visual(this,r);
  r_00 = xr_reader::open_chunk(r,0x18);
  s = r_00;
  if (r_00 != (xr_reader *)0x0) {
    load_s_userdata(this,r_00);
    bVar3 = xr_reader::eof(r_00);
    if (!bVar3) {
      __assert_fail("s->eof()",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_ogf_v3.cxx"
                    ,0x372,"void xray_re::xr_ogf_v3::load_kinematics(xr_reader &)");
    }
    xr_reader::close_chunk(r,&s);
  }
  sVar5 = xr_reader::find_chunk(r,0xd);
  if (sVar5 == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_ogf_v3.cxx"
                  ,0x377,"void xray_re::xr_ogf_v3::load_kinematics(xr_reader &)");
  }
  load_s_bone_names(this,r);
  s = xr_reader::open_chunk(r,0x1c);
  if (s == (xr_reader *)0x0) {
    s = xr_reader::open_chunk(r,0x19);
    if (s == (xr_reader *)0x0) {
      s = xr_reader::open_chunk(r,0x17);
      if (s == (xr_reader *)0x0) goto LAB_0016ea21;
      load_s_ikdata_0(this,s);
      bVar3 = xr_reader::eof(s);
      if (!bVar3) {
        __assert_fail("s->eof()",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_ogf_v3.cxx"
                      ,0x38a,"void xray_re::xr_ogf_v3::load_kinematics(xr_reader &)");
      }
    }
    else {
      load_s_ikdata(this,s);
      bVar3 = xr_reader::eof(s);
      if (!bVar3) {
        __assert_fail("s->eof()",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_ogf_v3.cxx"
                      ,900,"void xray_re::xr_ogf_v3::load_kinematics(xr_reader &)");
      }
    }
  }
  else {
    load_s_ikdata_2(this,s);
    bVar3 = xr_reader::eof(s);
    if (!bVar3) {
      __assert_fail("s->eof()",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_ogf_v3.cxx"
                    ,0x37e,"void xray_re::xr_ogf_v3::load_kinematics(xr_reader &)");
    }
  }
  xr_reader::close_chunk(r,&s);
LAB_0016ea21:
  xr_object::calculate_bind((xr_object *)this);
  local_48 = 0;
  while( true ) {
    ppxVar1 = (this->super_xr_ogf).m_children.
              super__Vector_base<xray_re::xr_ogf_*,_std::allocator<xray_re::xr_ogf_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (local_48 ==
        (long)(this->super_xr_ogf).m_children.
              super__Vector_base<xray_re::xr_ogf_*,_std::allocator<xray_re::xr_ogf_*>_>._M_impl.
              super__Vector_impl_data._M_finish - (long)ppxVar1 >> 3) break;
    iVar4 = (*(ppxVar1[local_48]->super_xr_object).super_xr_surface_factory._vptr_xr_surface_factory
              [0x1f])();
    lVar6 = CONCAT44(extraout_var,iVar4);
    lVar8 = 0;
    lVar9 = 0;
    for (lVar7 = 0; lVar7 != *(long *)(lVar6 + 0x10); lVar7 = lVar7 + 1) {
      lVar2 = *(long *)(lVar6 + 0x20);
      _vector3<float>::transform
                (&temp,(_vector3<float> *)(lVar2 + lVar8),
                 &(this->super_xr_ogf).super_xr_object.m_bones.
                  super__Vector_base<xray_re::xr_bone_*,_std::allocator<xray_re::xr_bone_*>_>.
                  _M_impl.super__Vector_impl_data._M_start
                  [*(int *)(*(long *)(lVar6 + 0x40) + lVar9)]->m_bind_xform);
      *(undefined8 *)(lVar2 + lVar8) = temp.field_0._0_8_;
      *(float *)(lVar2 + 8 + lVar8) = temp.field_0.field_0.z;
      lVar9 = lVar9 + 0x24;
      lVar8 = lVar8 + 0xc;
    }
    local_48 = local_48 + 1;
  }
  return;
}

Assistant:

void xr_ogf_v3::load_kinematics(xr_reader& r)
{
	load_hierrarhy_visual(r);

	xr_reader* s = r.open_chunk(OGF3_S_USERDATA);
	if (s) {
		load_s_userdata(*s);
		assert(s->eof());
		r.close_chunk(s);
	}

	if (!r.find_chunk(OGF3_S_BONE_NAMES))
		xr_not_expected();
	load_s_bone_names(r);
	r.debug_find_chunk();

	s = r.open_chunk(OGF3_S_IKDATA_2);
	if (s) {
		load_s_ikdata_2(*s);
		xr_assert(s->eof());
		r.close_chunk(s);
	} else {
		s = r.open_chunk(OGF3_S_IKDATA);
		if (s) {
			load_s_ikdata(*s);
			xr_assert(s->eof());
			r.close_chunk(s);
		} else {
			s = r.open_chunk(OGF3_S_IKDATA_0);
			if (s) {
				load_s_ikdata_0(*s);
				xr_assert(s->eof());
				r.close_chunk(s);
			}
		}
	}

	//��������� ���������� ������ �� ������� ������������ ����� � ������� ������������ ������
	//������ ������� ������ ��� ��������
	calculate_bind();
	for(size_t j = 0; j!= children().size(); ++j)
	{
		const xr_vbuf & vb = children()[j]->vb();
		for (size_t i = 0; i != vb.size(); ++i)
		{
			const finfluence * weights =  vb.w() + i;
			int bone = weights->array[0].bone;
			fvector3 * pv = const_cast<fvector3 *>(vb.p() + i);
			const fmatrix& xform = bones()[bone]->bind_xform(); 
			fvector3 temp;
			temp.transform(*pv, xform);
			*pv = temp;
		}
	}
}